

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O3

void Acb_NtkCreateFanout(Acb_Ntk_t *p)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = (p->vObjType).nCap;
  iVar5 = (p->vFanouts).nCap;
  if (iVar5 < iVar2) {
    pVVar3 = (p->vFanouts).pArray;
    if (pVVar3 == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc((long)iVar2 << 4);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(pVVar3,(long)iVar2 << 4);
      iVar5 = (p->vFanouts).nCap;
    }
    (p->vFanouts).pArray = pVVar3;
    memset(pVVar3 + iVar5,0,(long)(iVar2 - iVar5) << 4);
    (p->vFanouts).nCap = iVar2;
  }
  (p->vFanouts).nSize = iVar2;
  iVar2 = (p->vObjType).nSize;
  if (1 < iVar2) {
    lVar6 = 1;
    do {
      lVar4 = (long)iVar2;
      if (lVar4 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[lVar6] != '\0') {
        if ((p->vObjFans).nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (p->vObjFans).pArray[lVar6];
        lVar7 = (long)iVar5;
        if ((lVar7 < 0) || ((p->vFanSto).nSize <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar1 = (p->vFanSto).pArray;
        if (0 < piVar1[lVar7]) {
          lVar4 = 0;
          do {
            iVar2 = piVar1[lVar7 + lVar4 + 1];
            if (((long)iVar2 < 0) || ((p->vFanouts).nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            lVar4 = lVar4 + 1;
            Vec_IntPush((p->vFanouts).pArray + iVar2,(int)lVar6);
          } while (lVar4 < piVar1[lVar7]);
          iVar2 = (p->vObjType).nSize;
          lVar4 = (long)iVar2;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar4);
  }
  return;
}

Assistant:

static inline void Acb_NtkCreateFanout( Acb_Ntk_t * p )
{
    int iObj; 
    Acb_NtkCleanObjFanout( p );
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjAddFaninFanout( p, iObj );
}